

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.cpp
# Opt level: O0

void __thiscall
LocalGraphTest_ObstacleUnreachable_Test::TestBody(LocalGraphTest_ObstacleUnreachable_Test *this)

{
  bool bVar1;
  Err *pEVar2;
  char *pcVar3;
  reference this_00;
  pointer pFVar4;
  Block *pBVar5;
  Expression **ppEVar6;
  LocalSet *set_00;
  SetInfluences *this_01;
  char *in_R9;
  AssertHelper local_770;
  Message local_768;
  uint local_75c;
  LocalSet local_758;
  size_type local_720;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_2;
  Message local_700;
  uint local_6f4;
  LocalSet local_6f0;
  size_type local_6b8;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_1;
  Message local_698;
  uint local_68c;
  size_type local_688;
  undefined1 local_680 [8];
  AssertionResult gtest_ar;
  undefined1 local_668 [8];
  LazyLocalGraph graph;
  Nop *nopB;
  Nop *nopA;
  LocalSet *set;
  Block *block;
  Function *func;
  string local_4c8;
  AssertHelper local_4a8;
  Message local_4a0 [4];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  basic_string_view<char,_std::char_traits<char>_> local_458;
  Result<wasm::Ok> local_448 [47];
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_;
  Module wasm;
  char *moduleText;
  LocalGraphTest_ObstacleUnreachable_Test *this_local;
  
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)anon_var_dwarf_1844d8;
  ::wasm::Module::Module((Module *)&gtest_ar_.message_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_458,(char *)wasm.tagsMap._M_h._M_single_bucket);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::parseModule
            (local_448,&gtest_ar_.message_,local_458._M_len,local_458._M_str,&local_480);
  pEVar2 = ::wasm::Result<wasm::Ok>::getErr(local_448);
  local_419 = pEVar2 == (Err *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_418,&local_419,(type *)0x0);
  ::wasm::Result<wasm::Ok>::~Result(local_448);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_480);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(local_4a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4c8,(internal *)local_418,
               (AssertionResult *)"WATParser::parseModule(wasm, moduleText).getErr()","true","false"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4a8,local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    testing::Message::~Message(local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  if (bVar1) {
    this_00 = std::
              vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ::operator[]((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            *)&wasm.exports.
                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(this_00);
    pBVar5 = ::wasm::Expression::cast<wasm::Block>(pFVar4->body);
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (pBVar5 + 0x20),0);
    set_00 = ::wasm::Expression::cast<wasm::LocalSet>(*ppEVar6);
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (pBVar5 + 0x20),1);
    ::wasm::Expression::cast<wasm::Nop>(*ppEVar6);
    ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (pBVar5 + 0x20),3);
    ::wasm::Expression::cast<wasm::Nop>(*ppEVar6);
    std::optional<wasm::Expression::Id>::optional<const_wasm::Expression::Id_&,_true>
              ((optional<wasm::Expression::Id> *)
               ((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 6),&::wasm::SpecificExpression<(wasm::Expression::Id)22>::SpecificId);
    ::wasm::LazyLocalGraph::LazyLocalGraph
              ((LazyLocalGraph *)local_668,pFVar4,&gtest_ar_.message_,
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._6_2_);
    this_01 = ::wasm::LazyLocalGraph::getSetInfluences((LazyLocalGraph *)local_668,set_00);
    local_688 = std::
                unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                ::size(this_01);
    local_68c = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_680,"graph.getSetInfluences(set).size()","0U",&local_688,&local_68c
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
    if (!bVar1) {
      testing::Message::Message(&local_698);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                 ,0x7d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_698);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_698);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
    ::wasm::LazyLocalGraph::canMoveSet(&local_6f0,(Expression *)local_668);
    local_6b8 = std::
                unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                ::size((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                        *)&local_6f0);
    local_6f4 = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_6b0,"graph.canMoveSet(set, nopA).size()","0U",&local_6b8,&local_6f4
              );
    std::
    unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
    ::~unordered_set((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                      *)&local_6f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
    if (!bVar1) {
      testing::Message::Message(&local_700);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                 ,0x7e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_700);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_700);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
    ::wasm::LazyLocalGraph::canMoveSet(&local_758,(Expression *)local_668);
    local_720 = std::
                unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                ::size((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                        *)&local_758);
    local_75c = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_718,"graph.canMoveSet(set, nopB).size()","0U",&local_720,&local_75c
              );
    std::
    unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
    ::~unordered_set((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                      *)&local_758);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
    if (!bVar1) {
      testing::Message::Message(&local_768);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
      testing::internal::AssertHelper::AssertHelper
                (&local_770,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                 ,0x7f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_770,&local_768);
      testing::internal::AssertHelper::~AssertHelper(&local_770);
      testing::Message::~Message(&local_768);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
    ::wasm::LazyLocalGraph::~LazyLocalGraph((LazyLocalGraph *)local_668);
  }
  ::wasm::Module::~Module((Module *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(LocalGraphTest, ObstacleUnreachable) {
  auto moduleText = R"wasm(
    (module
      (func $foo (result i32)
        ;; An unreachable between the set and get.
        (local $x i32)
        (local.set $x
          (i32.const 10)
        )
        (nop)
        (unreachable)
        (nop)
        (local.get $x)
      )
    )
  )wasm";
  Module wasm;
  ASSERT_FALSE(WATParser::parseModule(wasm, moduleText).getErr());
  auto* func = wasm.functions[0].get();
  auto* block = func->body->cast<Block>();
  auto* set = block->list[0]->cast<LocalSet>();
  auto* nopA = block->list[1]->cast<Nop>();
  auto* nopB = block->list[3]->cast<Nop>();

  LazyLocalGraph graph(func, &wasm, Nop::SpecificId);
  // The get is unreachable, and the set has no gets.
  EXPECT_EQ(graph.getSetInfluences(set).size(), 0U);
  EXPECT_EQ(graph.canMoveSet(set, nopA).size(), 0U);
  EXPECT_EQ(graph.canMoveSet(set, nopB).size(), 0U);
}